

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O1

void __thiscall FGLTexture::Clean(FGLTexture *this,bool all)

{
  FHardwareTexture *this_00;
  
  this_00 = this->mHwTexture;
  if (this_00 != (FHardwareTexture *)0x0) {
    if (all) {
      FHardwareTexture::~FHardwareTexture(this_00);
      operator_delete(this_00,0x30);
      this->mHwTexture = (FHardwareTexture *)0x0;
    }
    else {
      FHardwareTexture::Clean(this_00,false);
    }
    this->lastSampler = 0xfd;
    this->lastTranslation = -1;
  }
  return;
}

Assistant:

void FGLTexture::Clean(bool all)
{
	if (mHwTexture != nullptr) 
	{
		if (!all) mHwTexture->Clean(false);
		else
		{
			delete mHwTexture;
			mHwTexture = nullptr;
		}

		lastSampler = 253;
		lastTranslation = -1;
	}
}